

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::DeleteLogDestinations(void)

{
  long lVar1;
  unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *log_destination;
  
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 8) {
    std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>::
    reset((__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
          ((long)&log_destinations_ + lVar1),(pointer)0x0);
  }
  std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)sink_mutex_);
  std::
  __uniq_ptr_impl<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
           *)&sinks_,(pointer)0x0);
  pthread_rwlock_unlock((pthread_rwlock_t *)sink_mutex_);
  return;
}

Assistant:

void LogDestination::DeleteLogDestinations() {
  for (auto& log_destination : log_destinations_) {
    log_destination.reset();
  }
  SinkLock l{sink_mutex_};
  sinks_.reset();
}